

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

size_t __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::findParent
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  size_t __n;
  reference pvVar1;
  size_t in_RSI;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  size_t parent;
  size_t rep;
  size_t in_stack_ffffffffffffffc8;
  size_t sVar2;
  size_t local_8;
  
  __n = findRep(in_RDI,in_stack_ffffffffffffffc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&in_RDI->parents_,__n);
  local_8 = findRep(in_RDI,in_stack_ffffffffffffffc8);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&in_RDI->parents_,__n);
  if (*pvVar1 != local_8) {
    sVar2 = local_8;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->parents_,__n);
    *pvVar1 = sVar2;
  }
  if (local_8 == __n) {
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

inline size_t findParent(size_t v)
    {
        auto rep = findRep(v);
        auto parent = findRep(parents_[rep]);

        if (parents_[rep] != parent) { // update lookup.
            parents_[rep] = parent;
        }

        if (parent == rep) {
            return v;
        } else {
            return parent;
        }
    }